

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHaig.c
# Opt level: O3

Vec_Ptr_t * Abc_NtkHaigCreateClasses(Vec_Ptr_t *vMembers)

{
  size_t __size;
  long *plVar1;
  void *pvVar2;
  undefined8 *puVar3;
  long *plVar4;
  bool bVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 0x1002;
  pVVar6->nSize = 0;
  ppvVar7 = (void **)malloc(0x8010);
  pVVar6->pArray = ppvVar7;
  uVar9 = (ulong)(uint)vMembers->nSize;
  if (vMembers->nSize < 1) {
    return pVVar6;
  }
  uVar12 = 0;
  uVar10 = 0x1002;
  lVar11 = 0;
  do {
    plVar1 = *vMembers->pArray[lVar11];
    if (*plVar1 != 0) {
      __assert_fail("pRepr->pData == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcHaig.c"
                    ,0x54,"Vec_Ptr_t *Abc_NtkHaigCreateClasses(Vec_Ptr_t *)");
    }
    if ((*(uint *)(plVar1 + 4) & 0x10) == 0) {
      *(uint *)(plVar1 + 4) = *(uint *)(plVar1 + 4) | 0x10;
      uVar14 = (uint)uVar10;
      if (uVar12 == uVar14) {
        if ((int)uVar14 < 0x10) {
          if (pVVar6->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(pVVar6->pArray,0x80);
          }
          pVVar6->pArray = ppvVar7;
          pVVar6->nCap = 0x10;
          uVar10 = 0x10;
        }
        else {
          uVar10 = (ulong)(uVar14 * 2);
          if (pVVar6->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(uVar10 * 8);
          }
          else {
            ppvVar7 = (void **)realloc(pVVar6->pArray,uVar10 * 8);
          }
          pVVar6->pArray = ppvVar7;
          pVVar6->nCap = uVar14 * 2;
        }
      }
      else {
        ppvVar7 = pVVar6->pArray;
      }
      lVar8 = (long)(int)uVar12;
      uVar12 = uVar12 + 1;
      pVVar6->nSize = uVar12;
      ppvVar7[lVar8] = plVar1;
      uVar9 = (ulong)(uint)vMembers->nSize;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 < (int)uVar9);
  bVar5 = 0 < (int)uVar12;
  if ((int)uVar12 < 1) {
    bVar5 = false;
  }
  else {
    ppvVar7 = pVVar6->pArray;
    uVar9 = 0;
    do {
      pvVar2 = ppvVar7[uVar9];
      *(uint *)((long)pvVar2 + 0x20) = *(uint *)((long)pvVar2 + 0x20) & 0xffffffef;
      *(void **)pvVar2 = pvVar2;
      uVar9 = uVar9 + 1;
    } while (uVar12 != uVar9);
    uVar9 = (ulong)(uint)vMembers->nSize;
  }
  if ((int)uVar9 < 1) {
    if (!bVar5) {
      return pVVar6;
    }
  }
  else {
    lVar11 = 0;
    do {
      puVar3 = (undefined8 *)vMembers->pArray[lVar11];
      if (*(int *)((long)puVar3 + 0x24) < *(int *)(*(long *)*puVar3 + 0x24)) {
        *(long *)*puVar3 = (long)puVar3;
        uVar9 = (ulong)(uint)vMembers->nSize;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (int)uVar9);
    if (0 < (int)uVar9) {
      lVar11 = 0;
      do {
        plVar1 = (long *)vMembers->pArray[lVar11];
        lVar8 = *(long *)*plVar1;
        *plVar1 = lVar8;
        if (*(int *)((long)plVar1 + 0x24) < *(int *)(lVar8 + 0x24)) {
          __assert_fail("((Hop_Obj_t *)pObj->pData)->Id <= pObj->Id",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcHaig.c"
                        ,0x70,"Vec_Ptr_t *Abc_NtkHaigCreateClasses(Vec_Ptr_t *)");
        }
        lVar11 = lVar11 + 1;
        uVar9 = (ulong)vMembers->nSize;
      } while (lVar11 < (long)uVar9);
    }
    if (!bVar5) goto LAB_0088fad4;
  }
  uVar10 = 0;
  do {
    plVar1 = (long *)pVVar6->pArray[uVar10];
    plVar4 = (long *)*plVar1;
    if ((long *)*plVar4 != plVar4) {
      __assert_fail("pRepr->pData == pRepr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcHaig.c"
                    ,0x77,"Vec_Ptr_t *Abc_NtkHaigCreateClasses(Vec_Ptr_t *)");
    }
    pVVar6->pArray[uVar10] = plVar4;
    iVar13 = (int)uVar9;
    if (iVar13 == vMembers->nCap) {
      if (iVar13 < 0x10) {
        if (vMembers->pArray == (void **)0x0) {
          ppvVar7 = (void **)malloc(0x80);
        }
        else {
          ppvVar7 = (void **)realloc(vMembers->pArray,0x80);
        }
        vMembers->pArray = ppvVar7;
        vMembers->nCap = 0x10;
      }
      else {
        __size = (ulong)(uint)(iVar13 * 2) * 8;
        if (vMembers->pArray == (void **)0x0) {
          ppvVar7 = (void **)malloc(__size);
        }
        else {
          ppvVar7 = (void **)realloc(vMembers->pArray,__size);
        }
        vMembers->pArray = ppvVar7;
        vMembers->nCap = iVar13 * 2;
      }
    }
    else {
      ppvVar7 = vMembers->pArray;
    }
    iVar13 = vMembers->nSize;
    uVar14 = iVar13 + 1;
    uVar9 = (ulong)uVar14;
    vMembers->nSize = uVar14;
    ppvVar7[iVar13] = plVar1;
    uVar10 = uVar10 + 1;
  } while (uVar12 != uVar10);
LAB_0088fad4:
  if (0 < (int)uVar9) {
    lVar11 = 0;
    do {
      puVar3 = (undefined8 *)vMembers->pArray[lVar11];
      if ((undefined8 *)*puVar3 == puVar3) {
        *puVar3 = 0;
        uVar9 = (ulong)(uint)vMembers->nSize;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < (int)uVar9);
  }
  return pVVar6;
}

Assistant:

Vec_Ptr_t * Abc_NtkHaigCreateClasses( Vec_Ptr_t * vMembers )
{
    Vec_Ptr_t * vClasses;
    Hop_Obj_t * pObj, * pRepr;
    int i;

    // count classes
    vClasses = Vec_PtrAlloc( 4098 );
    Vec_PtrForEachEntry( Hop_Obj_t *, vMembers, pObj, i )
    {
        pRepr = (Hop_Obj_t *)pObj->pData;
        assert( pRepr->pData == NULL );
        if ( pRepr->fMarkA == 0 ) // new
        {
            pRepr->fMarkA = 1;
            Vec_PtrPush( vClasses, pRepr );
        }
    }

    // set representatives as representatives
    Vec_PtrForEachEntry( Hop_Obj_t *, vClasses, pObj, i )
    {
        pObj->fMarkA = 0;
        pObj->pData = pObj;
    }

    // go through the members and update
    Vec_PtrForEachEntry( Hop_Obj_t *, vMembers, pObj, i )
    {
        pRepr = (Hop_Obj_t *)pObj->pData;
        if ( ((Hop_Obj_t *)pRepr->pData)->Id > pObj->Id )
            pRepr->pData = pObj;
    }

    // change representatives of the class
    Vec_PtrForEachEntry( Hop_Obj_t *, vMembers, pObj, i )
    {
        pRepr = (Hop_Obj_t *)pObj->pData;
        pObj->pData = pRepr->pData;
        assert( ((Hop_Obj_t *)pObj->pData)->Id <= pObj->Id );
    }

    // update classes
    Vec_PtrForEachEntry( Hop_Obj_t *, vClasses, pObj, i )
    {
        pRepr = (Hop_Obj_t *)pObj->pData;
        assert( pRepr->pData == pRepr );
//        pRepr->pData = NULL;
        Vec_PtrWriteEntry( vClasses, i, pRepr );
        Vec_PtrPush( vMembers, pObj );
    }

    Vec_PtrForEachEntry( Hop_Obj_t *, vMembers, pObj, i )
        if ( pObj->pData == pObj )
            pObj->pData = NULL;

/*
    Vec_PtrForEachEntry( Hop_Obj_t *, vMembers, pObj, i )
    {
        printf( "ObjId = %4d : ", pObj->Id );
        if ( pObj->pData == NULL )
        {
            printf( "NULL" );
        }
        else
        {
            printf( "%4d", ((Hop_Obj_t *)pObj->pData)->Id );
            assert( ((Hop_Obj_t *)pObj->pData)->Id <= pObj->Id );
        }
        printf( "\n" );
    }
*/
    return vClasses;
}